

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTDMT_computeOverlapSize(ZSTD_CCtx_params *params)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = params->overlapLog;
  if (9 < uVar3) {
    __assert_fail("0 <= ovlog && ovlog <= 9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4f14,"int ZSTDMT_overlapLog(int, ZSTD_strategy)");
  }
  if (uVar3 == 0) {
    uVar1 = (params->cParams).strategy - ZSTD_lazy2;
    uVar3 = 6;
    if (uVar1 < 5) {
      uVar3 = *(uint *)(&DAT_001b5820 + (ulong)uVar1 * 4);
    }
  }
  uVar1 = 0;
  if (1 < uVar3) {
    uVar1 = (params->cParams).windowLog - (9 - uVar3);
  }
  if ((params->ldmParams).enableLdm != 0) {
    uVar1 = (params->cParams).windowLog;
    uVar4 = (params->cParams).chainLog + 4;
    if (uVar4 < 0x16) {
      uVar4 = 0x15;
    }
    if (0x1d < uVar4) {
      uVar4 = 0x1e;
    }
    if (uVar4 - 2 <= uVar1) {
      uVar1 = (params->cParams).chainLog + 4;
      uVar4 = 0x15;
      if (0x15 < uVar1) {
        uVar4 = uVar1;
      }
      uVar1 = 0x1e;
      if (uVar4 < 0x1e) {
        uVar1 = uVar4;
      }
      uVar1 = uVar1 - 2;
    }
    uVar1 = uVar1 - (9 - uVar3);
  }
  if (uVar1 < 0x20) {
    sVar2 = 0;
    if (uVar1 != 0) {
      sVar2 = 1L << ((byte)uVar1 & 0x3f);
    }
    return sVar2;
  }
  __assert_fail("0 <= ovLog && ovLog <= ZSTD_WINDOWLOG_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x4f26,"size_t ZSTDMT_computeOverlapSize(const ZSTD_CCtx_params *)");
}

Assistant:

static size_t ZSTDMT_computeOverlapSize(const ZSTD_CCtx_params* params)
{
    int const overlapRLog = 9 - ZSTDMT_overlapLog(params->overlapLog, params->cParams.strategy);
    int ovLog = (overlapRLog >= 8) ? 0 : (params->cParams.windowLog - overlapRLog);
    assert(0 <= overlapRLog && overlapRLog <= 8);
    if (params->ldmParams.enableLdm) {
        /* In Long Range Mode, the windowLog is typically oversized.
         * In which case, it's preferable to determine the jobSize
         * based on chainLog instead.
         * Then, ovLog becomes a fraction of the jobSize, rather than windowSize */
        ovLog = MIN(params->cParams.windowLog, ZSTDMT_computeTargetJobLog(params) - 2)
                - overlapRLog;
    }
    assert(0 <= ovLog && ovLog <= ZSTD_WINDOWLOG_MAX);
    DEBUGLOG(4, "overlapLog : %i", params->overlapLog);
    DEBUGLOG(4, "overlap size : %i", 1 << ovLog);
    return (ovLog==0) ? 0 : (size_t)1 << ovLog;
}